

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.cc
# Opt level: O2

void __thiscall t_server::~t_server(t_server *this)

{
  pointer pptVar1;
  
  while (pptVar1 = (this->v_clients).super__Vector_base<t_client_*,_std::allocator<t_client_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
        (this->v_clients).super__Vector_base<t_client_*,_std::allocator<t_client_*>_>._M_impl.
        super__Vector_impl_data._M_start != pptVar1) {
    t_client::f_remove(pptVar1[-1]);
  }
  std::_Vector_base<t_client_*,_std::allocator<t_client_*>_>::~_Vector_base
            ((_Vector_base<t_client_*,_std::allocator<t_client_*>_> *)this);
  return;
}

Assistant:

t_server::~t_server()
{
	while (!v_clients.empty()) v_clients.back()->f_remove();
}